

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_wstring.cpp
# Opt level: O2

bool IsValidRealNumber(wchar_t *wsz,int length)

{
  wchar_t __wc;
  bool bVar1;
  int iVar2;
  int iVar3;
  byte bVar4;
  bool bVar5;
  ulong uVar6;
  int local_3c;
  
  if (length == 0) {
LAB_00672959:
    bVar5 = false;
  }
  else {
    iVar3 = 0;
    if (length < 1) {
      length = 0;
    }
    bVar4 = 1;
    local_3c = 0;
    bVar5 = false;
    for (uVar6 = 0; (uint)length != uVar6; uVar6 = uVar6 + 1) {
      __wc = wsz[uVar6];
      iVar2 = iswspace(__wc);
      if (iVar2 == 0) {
        if ((__wc & 0xfffffffdU) == 0x2c) {
          iVar3 = iVar3 + 1;
        }
        else if ((__wc & 0xffffffdfU) == 0x45) {
          local_3c = local_3c + 1;
        }
        else {
          iVar2 = iswdigit(__wc);
          if (((iVar2 == 0) && (__wc != L'-')) && (__wc != L'+')) goto LAB_00672959;
        }
        bVar4 = 0;
        bVar1 = false;
        if (bVar5) {
          return false;
        }
      }
      else {
        bVar1 = (bool)(bVar4 ^ 1 | bVar5);
      }
      bVar5 = bVar1;
    }
    bVar5 = local_3c < 2 && iVar3 < 2;
  }
  return bVar5;
}

Assistant:

static bool IsValidRealNumber(const wchar_t* wsz, int length)
{
  if (length == 0)
    return false;

  int puncCount = 0;
  int eCount = 0;

  bool bAtStart = true;
  bool bAtEnd = false;

  for (int i = 0; i < length; i++)
  {
    const auto w = wsz[i];

    // Skip past whitespace at the start of the string.
    if (iswspace(w))
    {
      if (bAtStart)
      {
        // Skip past white space at the beginning of string.
        continue;
      }
      else
      {
        // Otherwise, whitespace can only appear at the end of the string.
        bAtEnd = true;
        continue;
      }
    }

    if (w == L'.' || w == L',') puncCount++;
    else
    if (w == L'e' || w == L'E') eCount++;
    else
    if (!iswdigit(w) && (w != L'-') && (w != L'+'))
      return false;

    // Nothing can come after spaces at the end.
    if (bAtEnd)
      return false;

    bAtStart = false;
  }

  if ((puncCount > 1) || (eCount > 1))
    return false;

  return true;
}